

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeQQQRegisterClass(MCInst *Inst,uint RegNo,uint64_t Addr,void *Decoder)

{
  uint Register;
  void *Decoder_local;
  uint64_t Addr_local;
  uint RegNo_local;
  MCInst *Inst_local;
  
  if (RegNo < 0x20) {
    MCOperand_CreateReg0(Inst,QQQDecoderTable[RegNo]);
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeQQQRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Addr, void *Decoder)
{
	unsigned Register;

	if (RegNo > 31)
		return Fail;

	Register = QQQDecoderTable[RegNo];
	MCOperand_CreateReg0(Inst, Register);
	return Success;
}